

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool CanonicalizePath(char *path,size_t *len,uint64_t *slash_bits,string *err)

{
  Metrics *this;
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  byte local_2bd;
  Metric *local_2b0;
  char *end;
  char *src;
  char *dst;
  char *start;
  int component_count;
  char *components [60];
  int kMaxPathComponents;
  ScopedMetric metrics_h_scoped;
  bool local_52;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  uint64_t *slash_bits_local;
  size_t *len_local;
  char *path_local;
  
  local_30 = err;
  err_local = (string *)slash_bits;
  slash_bits_local = len;
  len_local = (size_t *)path;
  if ((CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)::metrics_h_metric
       == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)
                                   ::metrics_h_metric), this = g_metrics, iVar3 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_52 = g_metrics == (Metrics *)0x0;
    if (local_52) {
      local_2b0 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"canonicalize path",&local_51);
      metrics_h_scoped.start_._3_1_ = 1;
      local_2b0 = Metrics::NewMetric(this,&local_50);
    }
    local_52 = !local_52;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (local_52) {
      std::allocator<char>::~allocator(&local_51);
    }
    CanonicalizePath::metrics_h_metric = local_2b0;
    __cxa_guard_release(&CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&kMaxPathComponents,CanonicalizePath::metrics_h_metric)
  ;
  psVar1 = len_local;
  if (*slash_bits_local == 0) {
    std::__cxx11::string::operator=((string *)local_30,"empty path");
    path_local._7_1_ = 0;
  }
  else {
    start._4_4_ = 0;
    src = (char *)len_local;
    pcVar4 = (char *)((long)len_local + *slash_bits_local);
    bVar2 = IsPathSeparator((char)*len_local);
    end = src;
    if (bVar2) {
      end = (char *)((long)psVar1 + 1);
      src = end;
    }
LAB_00142577:
    if (end < pcVar4) {
      if (*end == '.') {
        if ((end + 1 == pcVar4) || (bVar2 = IsPathSeparator(end[1]), bVar2)) {
          end = end + 2;
          goto LAB_00142577;
        }
        if ((end[1] == '.') && ((end + 2 == pcVar4 || (bVar2 = IsPathSeparator(end[2]), bVar2)))) {
          if (start._4_4_ < 1) {
            *src = *end;
            pcVar5 = src + 2;
            src[1] = end[1];
            src = src + 3;
            *pcVar5 = end[2];
          }
          else {
            src = *(char **)(&stack0xfffffffffffffd98 + (long)(start._4_4_ + -1) * 8);
            start._4_4_ = start._4_4_ + -1;
          }
          end = end + 3;
          goto LAB_00142577;
        }
      }
      bVar2 = IsPathSeparator(*end);
      if (bVar2) {
        end = end + 1;
      }
      else {
        if (start._4_4_ == 0x3c) {
          Fatal("path has too many components : %s",len_local);
        }
        *(char **)(&stack0xfffffffffffffd98 + (long)start._4_4_ * 8) = src;
        start._4_4_ = start._4_4_ + 1;
        while( true ) {
          local_2bd = 0;
          if (end != pcVar4) {
            bVar2 = IsPathSeparator(*end);
            local_2bd = bVar2 ^ 0xff;
          }
          if ((local_2bd & 1) == 0) break;
          *src = *end;
          end = end + 1;
          src = src + 1;
        }
        *src = *end;
        end = end + 1;
        src = src + 1;
      }
      goto LAB_00142577;
    }
    if ((size_t *)src == psVar1) {
      pcVar4 = src + 1;
      *src = '.';
      src = src + 2;
      *pcVar4 = '\0';
    }
    *slash_bits_local = (uint64_t)(src + (-1 - (long)psVar1));
    *(undefined8 *)err_local = 0;
    path_local._7_1_ = 1;
  }
  ScopedMetric::~ScopedMetric((ScopedMetric *)&kMaxPathComponents);
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool CanonicalizePath(char* path, size_t* len, uint64_t* slash_bits,
                      string* err) {
  // WARNING: this function is performance-critical; please benchmark
  // any changes you make to it.
  METRIC_RECORD("canonicalize path");
  if (*len == 0) {
    *err = "empty path";
    return false;
  }

  const int kMaxPathComponents = 60;
  char* components[kMaxPathComponents];
  int component_count = 0;

  char* start = path;
  char* dst = start;
  const char* src = start;
  const char* end = start + *len;

  if (IsPathSeparator(*src)) {
#ifdef _WIN32

    // network path starts with //
    if (*len > 1 && IsPathSeparator(*(src + 1))) {
      src += 2;
      dst += 2;
    } else {
      ++src;
      ++dst;
    }
#else
    ++src;
    ++dst;
#endif
  }

  while (src < end) {
    if (*src == '.') {
      if (src + 1 == end || IsPathSeparator(src[1])) {
        // '.' component; eliminate.
        src += 2;
        continue;
      } else if (src[1] == '.' && (src + 2 == end || IsPathSeparator(src[2]))) {
        // '..' component.  Back up if possible.
        if (component_count > 0) {
          dst = components[component_count - 1];
          src += 3;
          --component_count;
        } else {
          *dst++ = *src++;
          *dst++ = *src++;
          *dst++ = *src++;
        }
        continue;
      }
    }

    if (IsPathSeparator(*src)) {
      src++;
      continue;
    }

    if (component_count == kMaxPathComponents)
      Fatal("path has too many components : %s", path);
    components[component_count] = dst;
    ++component_count;

    while (src != end && !IsPathSeparator(*src))
      *dst++ = *src++;
    *dst++ = *src++;  // Copy '/' or final \0 character as well.
  }

  if (dst == start) {
    *dst++ = '.';
    *dst++ = '\0';
  }

  *len = dst - start - 1;
#ifdef _WIN32
  uint64_t bits = 0;
  uint64_t bits_mask = 1;

  for (char* c = start; c < start + *len; ++c) {
    switch (*c) {
      case '\\':
        bits |= bits_mask;
        *c = '/';
        NINJA_FALLTHROUGH;
      case '/':
        bits_mask <<= 1;
    }
  }

  *slash_bits = bits;
#else
  *slash_bits = 0;
#endif
  return true;
}